

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution1D_x86_avx512::forward
          (Convolution1D_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Mat *in_RCX;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  bool bVar1;
  int outh;
  int outw;
  size_t out_elemsize;
  int out_elempack;
  Mat bottom_blob_bordered;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int w;
  int in_stack_00004a40;
  int in_stack_00004a44;
  Mat *in_stack_00004a48;
  Mat *in_stack_00004a50;
  Mat *in_stack_00004a58;
  Mat *in_stack_00004a60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  Mat *in_stack_fffffffffffffe78;
  Convolution1D *in_stack_fffffffffffffe80;
  Option *in_stack_fffffffffffffe88;
  void **ppvVar2;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined8 in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  void *local_f8;
  int *local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  long *local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  int local_c0;
  long local_b8;
  int local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined4 local_9c;
  Mat *local_98;
  long *local_90;
  int local_74;
  void **local_70;
  long *local_68;
  void **local_60;
  void **local_58;
  void **local_48;
  long *local_40;
  int local_28;
  undefined4 local_24;
  void **local_20;
  void *local_18;
  
  local_9c = *(undefined4 *)(in_RSI + 0x2c);
  local_a8 = *(undefined8 *)(in_RSI + 0x10);
  local_ac = *(undefined4 *)(in_RSI + 0x18);
  local_b0 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) *
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) + -1) + 1;
  local_70 = &local_f8;
  local_f8 = (void *)0x0;
  local_f0 = (int *)0x0;
  local_e8 = 0;
  local_e0 = 0;
  local_d8 = (long *)0x0;
  local_d0 = 0;
  local_cc = 0;
  local_c8 = 0;
  local_c4 = 0;
  local_c0 = 0;
  local_b8 = 0;
  local_98 = in_RCX;
  local_90 = in_RDX;
  Convolution1D::make_padding
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (Option *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_60 = &local_f8;
  if (local_f8 != (void *)0x0) {
    local_48 = local_60;
  }
  if (local_f8 != (void *)0x0 && local_b8 * local_c0 != 0) {
    local_9c = local_cc;
    Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)in_stack_fffffffffffffe98,
                CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                (Allocator *)in_stack_fffffffffffffe80);
    local_68 = local_90;
    bVar1 = true;
    if (*local_90 != 0) {
      local_40 = local_90;
      bVar1 = local_90[8] * (long)(int)local_90[7] == 0;
    }
    if (bVar1) {
      local_74 = -100;
    }
    else {
      convolution1d_packed
                (in_stack_00004a60,in_stack_00004a58,in_stack_00004a50,in_stack_00004a48,
                 in_stack_00004a44,in_stack_00004a40,
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4),
                 (int)in_RDI + 0xf8 + (int)*(long *)(*in_RDI + -0x18),local_98,
                 in_stack_fffffffffffffe88);
      local_74 = 0;
    }
  }
  else {
    local_74 = -100;
  }
  ppvVar2 = &local_f8;
  if (local_f0 != (int *)0x0) {
    local_24 = 0xffffffff;
    LOCK();
    local_28 = *local_f0;
    *local_f0 = *local_f0 + -1;
    UNLOCK();
    if (local_28 == 1) {
      local_58 = ppvVar2;
      local_20 = ppvVar2;
      if (local_d8 == (long *)0x0) {
        local_18 = local_f8;
        if (local_f8 != (void *)0x0) {
          free(local_f8);
        }
      }
      else {
        (**(code **)(*local_d8 + 0x18))(local_d8,local_f8);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_74;
}

Assistant:

int Convolution1D_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}